

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,RATiedFlags flags,RegMask useRegMask,
          uint32_t useId,uint32_t useRewriteMask,RegMask outRegMask,uint32_t outId,
          uint32_t outRewriteMask,uint32_t rmSize,uint32_t consecutiveParent)

{
  long lVar1;
  RATiedReg *this_00;
  byte bVar2;
  Error EVar3;
  uint32_t *puVar4;
  byte bVar5;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  uint *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint32_t in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  int in_stack_00000028;
  RATiedReg *tiedReg;
  RegGroup group;
  undefined4 in_stack_00000204;
  int in_stack_0000020c;
  undefined4 in_stack_00000214;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  RegGroup group_00;
  undefined4 in_stack_fffffffffffffe1c;
  byte local_1cc;
  int local_19c;
  uint local_198;
  uint local_194;
  uint *local_190;
  uint local_16c;
  uint *local_168;
  undefined4 local_15c;
  uint *local_158;
  undefined4 local_14c;
  uint *local_148;
  undefined4 *local_140;
  int *local_138;
  uint *local_130;
  uint *local_128;
  uint *local_120;
  int *local_118;
  undefined4 *local_110;
  int local_100;
  byte local_f9;
  uint *local_f8;
  int *local_f0;
  int *local_e8;
  uint local_e0;
  byte local_d9;
  uint *local_d8;
  uint *local_d0;
  uint *local_c8;
  RATiedReg *local_b8;
  uint *local_b0;
  uint local_a4;
  uint *local_a0;
  long local_98;
  long local_90;
  long local_88;
  int local_7c;
  long local_78;
  long local_70;
  
  local_128 = in_RSI + 8;
  bVar2 = (byte)(*local_128 >> 8) & 0xf;
  lVar1 = *(long *)(in_RSI + 4);
  local_19c = in_R8D;
  local_198 = in_ECX;
  local_194 = in_EDX;
  local_190 = in_RSI;
  local_120 = local_128;
  if (in_R8D != 0xff) {
    local_f8 = in_RDI + 5;
    local_100 = bVar2 + 8;
    local_f0 = &local_100;
    *local_f8 = 1 << (sbyte)local_100 | *local_f8;
    local_138 = &local_19c;
    local_118 = local_138;
    local_f9 = bVar2;
    local_e8 = local_f0;
    puVar4 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                       ((RARegMask *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    *puVar4 = 1 << ((byte)in_R8D & 0x1f) | *puVar4;
    local_148 = &local_194;
    local_14c = 0x40;
    local_194 = local_194 | 0x40;
  }
  if (in_stack_00000010 != 0xff) {
    local_140 = &stack0x00000010;
    bVar5 = (byte)in_stack_00000010;
    local_110 = local_140;
    puVar4 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                       ((RARegMask *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    *puVar4 = 1 << (bVar5 & 0x1f) | *puVar4;
    local_158 = &local_194;
    local_15c = 0x80;
    local_194 = local_194 | 0x80;
  }
  group_00 = (RegGroup)((uint)in_stack_fffffffffffffe14 >> 0x18);
  local_168 = in_RDI + 2;
  local_16c = local_194;
  *local_168 = *local_168 | local_194;
  local_d8 = in_RDI + 5;
  local_e0 = (uint)bVar2;
  local_d0 = &local_e0;
  *local_d8 = 1 << bVar2 | *local_d8;
  local_d9 = bVar2;
  local_c8 = local_d0;
  if (lVar1 == 0) {
    if (0x7f < (uint)(*(long *)(in_RDI + 0xe) - (long)(in_RDI + 0x10) >> 5)) {
      DebugUtils::assertionFailed
                ((char *)CONCAT44(in_stack_00000214,outRewriteMask),in_stack_0000020c,
                 (char *)CONCAT44(in_stack_00000204,outRegMask));
    }
    this_00 = *(RATiedReg **)(in_RDI + 0xe);
    *(RATiedReg **)(in_RDI + 0xe) = this_00 + 1;
    local_130 = local_190;
    RATiedReg::init(this_00,(EVP_PKEY_CTX *)(ulong)*local_190);
    local_b0 = local_190;
    *(RATiedReg **)(local_190 + 4) = this_00;
    local_a4 = *in_RDI;
    local_a0 = local_190;
    local_190[10] = local_a4;
    local_b8 = this_00;
    RARegCount::add((RARegCount *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_00000018),group_00,
                    in_stack_00000010);
  }
  else {
    local_90 = lVar1;
    if (in_stack_00000028 != *(int *)(lVar1 + 4)) {
      local_98 = lVar1;
      if (*(int *)(lVar1 + 4) != -1) {
        EVar3 = DebugUtils::errored(3);
        return EVar3;
      }
      *(int *)(lVar1 + 4) = in_stack_00000028;
    }
    if (local_19c != 0xff) {
      local_88 = lVar1;
      if (*(char *)(lVar1 + 0xe) != -1) {
        EVar3 = DebugUtils::errored(0x41);
        return EVar3;
      }
      local_7c = local_19c;
      *(char *)(lVar1 + 0xe) = (char)local_19c;
      local_78 = lVar1;
    }
    if (in_stack_00000010 != 0xff) {
      if (*(char *)(lVar1 + 0xf) != -1) {
        local_70 = lVar1;
        EVar3 = DebugUtils::errored(0x41);
        return EVar3;
      }
      *(char *)(lVar1 + 0xf) = (char)in_stack_00000010;
    }
    *(char *)(lVar1 + 0xc) = *(char *)(lVar1 + 0xc) + '\x01';
    *(uint *)(lVar1 + 8) = *(uint *)(lVar1 + 8) | local_194;
    *(uint *)(lVar1 + 0x10) = local_198 & *(uint *)(lVar1 + 0x10);
    *(uint *)(lVar1 + 0x18) = in_R9D | *(uint *)(lVar1 + 0x18);
    *(uint *)(lVar1 + 0x14) = in_stack_00000008 & *(uint *)(lVar1 + 0x14);
    *(uint *)(lVar1 + 0x1c) = in_stack_00000018 | *(uint *)(lVar1 + 0x1c);
    local_1cc = *(byte *)(lVar1 + 0xd);
    if (local_1cc < in_stack_00000020) {
      local_1cc = (byte)in_stack_00000020;
    }
    *(byte *)(lVar1 + 0xd) = local_1cc;
  }
  return 0;
}

Assistant:

Error add(
    RAWorkReg* workReg,
    RATiedFlags flags,
    RegMask useRegMask, uint32_t useId, uint32_t useRewriteMask,
    RegMask outRegMask, uint32_t outId, uint32_t outRewriteMask,
    uint32_t rmSize = 0,
    uint32_t consecutiveParent = Globals::kInvalidId
  ) noexcept {
    RegGroup group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedFlags::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedFlags::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Would happen when the builder is not reset properly after each instruction - so catch that!
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, useRegMask, useId, useRewriteMask, outRegMask, outId, outRewriteMask, rmSize, consecutiveParent);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (consecutiveParent != tiedReg->consecutiveParent()) {
        if (tiedReg->consecutiveParent() != Globals::kInvalidId)
          return DebugUtils::errored(kErrorInvalidState);
        tiedReg->_consecutiveParent = consecutiveParent;
      }

      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_useRegMask &= useRegMask;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRegMask &= outRegMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }